

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemTaskTests.cpp
# Opt level: O2

void __thiscall
BuildSystemTaskTests_dirContentsHandleUpstreamFailure_Test::TestBody
          (BuildSystemTaskTests_dirContentsHandleUpstreamFailure_Test *this)

{
  undefined1 auVar1 [16];
  long *plVar2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar3;
  bool bVar4;
  raw_ostream *prVar5;
  char *__s;
  size_t sVar6;
  long lVar7;
  int line;
  error_code *EC;
  ulong uVar8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var9;
  char *in_R9;
  StringRef namePrefix;
  StringRef Filename;
  StringRef path;
  StringRef mainFilename;
  BuildSystem system;
  AssertHelper local_710;
  long *local_708;
  AssertionResult gtest_ar__2;
  AssertHelper local_6e8;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_6e0;
  AssertionResult gtest_ar__1;
  BuildKey keyToBuild;
  MockBuildSystemDelegate delegate;
  AssertionResult gtest_ar_;
  bool local_5a8;
  SmallString<256U> manifest;
  string local_490 [32];
  SmallString<256U> fakeDir;
  SmallString<256U> outputDir;
  TmpDir tempDir;
  SmallString<256U> builddb;
  
  namePrefix.Length = 8;
  namePrefix.Data = "TestBody";
  llbuild::TmpDir::TmpDir(&tempDir,namePrefix);
  llbuild::basic::createLocalFileSystem();
  llbuild::TmpDir::str_abi_cxx11_((string *)&outputDir,&tempDir);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&builddb.super_SmallVector<char,_256U>,
             (char *)outputDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
             (char *)(CONCAT44(outputDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                               super_SmallVectorTemplateBase<char,_true>.
                               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                               Capacity,outputDir.super_SmallVector<char,_256U>.
                                        super_SmallVectorImpl<char>.
                                        super_SmallVectorTemplateBase<char,_true>.
                                        super_SmallVectorTemplateCommon<char,_void>.
                                        super_SmallVectorBase.Size) +
                     (long)outputDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                           super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX)
            );
  std::__cxx11::string::_M_dispose();
  llvm::Twine::Twine((Twine *)&outputDir,"build.db");
  llvm::Twine::Twine((Twine *)&fakeDir,"");
  llvm::Twine::Twine((Twine *)&manifest,"");
  llvm::Twine::Twine((Twine *)&delegate,"");
  llvm::sys::path::append
            (&builddb.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,(Twine *)&outputDir,
             (Twine *)&fakeDir,(Twine *)&manifest,(Twine *)&delegate);
  for (uVar8 = 0;
      builddb.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Size != uVar8; uVar8 = uVar8 + 1) {
    if (*(char *)((long)builddb.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                        super_SmallVectorTemplateBase<char,_true>.
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
                 uVar8) == '\\') {
      *(undefined1 *)
       ((long)builddb.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.BeginX + uVar8) = 0x2f;
    }
  }
  llbuild::TmpDir::str_abi_cxx11_((string *)&fakeDir,&tempDir);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&outputDir.super_SmallVector<char,_256U>,
             (char *)fakeDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
             (char *)(CONCAT44(fakeDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                               super_SmallVectorTemplateBase<char,_true>.
                               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                               Capacity,fakeDir.super_SmallVector<char,_256U>.
                                        super_SmallVectorImpl<char>.
                                        super_SmallVectorTemplateBase<char,_true>.
                                        super_SmallVectorTemplateCommon<char,_void>.
                                        super_SmallVectorBase.Size) +
                     (long)fakeDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                           super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX)
            );
  std::__cxx11::string::_M_dispose();
  llvm::Twine::Twine((Twine *)&fakeDir,"output");
  llvm::Twine::Twine((Twine *)&manifest,"");
  llvm::Twine::Twine((Twine *)&delegate,"");
  llvm::Twine::Twine((Twine *)&gtest_ar_,"");
  llvm::sys::path::append
            (&outputDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,(Twine *)&fakeDir,
             (Twine *)&manifest,(Twine *)&delegate,(Twine *)&gtest_ar_);
  for (uVar8 = 0;
      outputDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Size != uVar8; uVar8 = uVar8 + 1) {
    if (*(char *)((long)outputDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                        super_SmallVectorTemplateBase<char,_true>.
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
                 uVar8) == '\\') {
      *(undefined1 *)
       ((long)outputDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.BeginX + uVar8) = 0x2f;
    }
  }
  llbuild::TmpDir::str_abi_cxx11_((string *)&manifest,&tempDir);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&fakeDir.super_SmallVector<char,_256U>,
             (char *)manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
             (char *)(CONCAT44(manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                               super_SmallVectorTemplateBase<char,_true>.
                               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                               Capacity,manifest.super_SmallVector<char,_256U>.
                                        super_SmallVectorImpl<char>.
                                        super_SmallVectorTemplateBase<char,_true>.
                                        super_SmallVectorTemplateCommon<char,_void>.
                                        super_SmallVectorBase.Size) +
                     (long)manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                           super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX)
            );
  std::__cxx11::string::_M_dispose();
  llvm::Twine::Twine((Twine *)&manifest,"fake");
  llvm::Twine::Twine((Twine *)&delegate,"");
  llvm::Twine::Twine((Twine *)&gtest_ar_,"");
  llvm::Twine::Twine((Twine *)&keyToBuild,"");
  llvm::sys::path::append
            (&fakeDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,(Twine *)&manifest,
             (Twine *)&delegate,(Twine *)&gtest_ar_,(Twine *)&keyToBuild);
  plVar2 = local_708;
  for (uVar8 = 0;
      fakeDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Size != uVar8; uVar8 = uVar8 + 1) {
    if (*(char *)((long)fakeDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                        super_SmallVectorTemplateBase<char,_true>.
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
                 uVar8) == '\\') {
      *(undefined1 *)
       ((long)fakeDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.BeginX + uVar8) = 0x2f;
    }
  }
  keyToBuild.key.key._M_string_length =
       (size_type)
       fakeDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size;
  keyToBuild.key.key._M_dataplus._M_p =
       (pointer)fakeDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                super_SmallVectorTemplateBase<char,_true>.
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  llvm::StringRef::str_abi_cxx11_((string *)&manifest,(StringRef *)&keyToBuild);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       outputDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size;
  gtest_ar__1._0_8_ =
       outputDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.BeginX;
  llvm::StringRef::str_abi_cxx11_((string *)&delegate,(StringRef *)&gtest_ar__1);
  bVar4 = (bool)(**(code **)(*plVar2 + 0x48))(plVar2,(string *)&manifest,&delegate);
  gtest_ar_.success_ = bVar4;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&delegate);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&manifest,(internal *)&gtest_ar_,
               (AssertionResult *)"localFS->createSymlink(fakeDir.str(), outputDir.str())","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&keyToBuild,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
               ,0x51b,(char *)manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                              super_SmallVectorTemplateBase<char,_true>.
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                              BeginX);
    testing::internal::AssertHelper::operator=((AssertHelper *)&keyToBuild,(Message *)&delegate);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&keyToBuild);
    std::__cxx11::string::_M_dispose();
    if (delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate != (_func_int **)0x0) {
      (**(code **)(*delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_00123c5f;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  llbuild::TmpDir::str_abi_cxx11_((string *)&delegate,&tempDir);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&manifest.super_SmallVector<char,_256U>,
             (char *)delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate,
             delegate.super_BuildSystemDelegate.name._M_dataplus._M_p +
             (long)delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate);
  std::__cxx11::string::_M_dispose();
  llvm::Twine::Twine((Twine *)&delegate,"manifest.llbuild");
  llvm::Twine::Twine((Twine *)&gtest_ar_,"");
  llvm::Twine::Twine((Twine *)&keyToBuild,"");
  llvm::Twine::Twine((Twine *)&gtest_ar__1,"");
  llvm::sys::path::append
            (&manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,(Twine *)&delegate,
             (Twine *)&gtest_ar_,(Twine *)&keyToBuild,(Twine *)&gtest_ar__1);
  gtest_ar_.success_ = false;
  gtest_ar_._1_3_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::_V2::system_category();
  Filename.Length._0_4_ =
       manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size;
  Filename.Data =
       (char *)manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase.BeginX;
  EC = (error_code *)&gtest_ar_;
  Filename.Length._4_4_ = 0;
  llvm::raw_fd_ostream::raw_fd_ostream((raw_fd_ostream *)&delegate,Filename,EC,F_Text);
  if (gtest_ar_._0_4_ != 0) {
    __assert_fail("!ec",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                  ,0x524,
                  "virtual void BuildSystemTaskTests_dirContentsHandleUpstreamFailure_Test::TestBody()"
                 );
  }
  prVar5 = llvm::raw_ostream::operator<<
                     ((raw_ostream *)&delegate,
                      "client:\n  name: mock\n\ntargets:\n  \"\": [\"<all>\"]\n\nnodes:\n  \"");
  prVar5 = llvm::raw_ostream::operator<<(prVar5,(SmallVectorImpl<char> *)&outputDir);
  prVar5 = llvm::raw_ostream::operator<<
                     (prVar5,
                      "\": {}\n\ncommands:\n  \"mkdir-output\":\n    tool: mkdir\n    outputs: [\"")
  ;
  prVar5 = llvm::raw_ostream::operator<<(prVar5,(SmallVectorImpl<char> *)&outputDir);
  prVar5 = llvm::raw_ostream::operator<<
                     (prVar5,
                      "\"]\n    description: \"mkdir-output\"\n  \"<all>\":\n    tool: phony\n    inputs: [\""
                     );
  prVar5 = llvm::raw_ostream::operator<<(prVar5,(SmallVectorImpl<char> *)&outputDir);
  llvm::raw_ostream::operator<<(prVar5,"/\"]\n    outputs: [\"<all>\"]\n");
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&delegate);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = EC;
  llbuild::buildsystem::BuildKey::makeTarget
            (&keyToBuild,(BuildKey *)0x1dca0f,(StringRef)(auVar1 << 0x40));
  llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate(&delegate,false);
  llbuild::basic::createLocalFileSystem();
  llbuild::buildsystem::BuildSystem::BuildSystem
            (&system,&delegate.super_BuildSystemDelegate,
             (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
              *)&local_6e0);
  if (local_6e0._M_head_impl != (FileSystem *)0x0) {
    (*(local_6e0._M_head_impl)->_vptr_FileSystem[1])();
  }
  local_6e0._M_head_impl = (FileSystem *)0x0;
  __s = llvm::SmallString<256U>::c_str(&builddb);
  if (__s == (char *)0x0) {
    sVar6 = 0;
  }
  else {
    sVar6 = strlen(__s);
  }
  path.Length = sVar6;
  path.Data = __s;
  llbuild::buildsystem::BuildSystem::attachDB(&system,path,(string *)0x0);
  mainFilename.Length._0_4_ =
       manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size;
  mainFilename.Data =
       (char *)manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase.BeginX;
  mainFilename.Length._4_4_ = 0;
  bVar4 = llbuild::buildsystem::BuildSystem::loadDescription(&system,mainFilename);
  gtest_ar__1.success_ = bVar4;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar4) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    std::__cxx11::string::string(local_490,(string *)&keyToBuild);
    llbuild::buildsystem::BuildSystem::build
              ((Optional<llbuild::buildsystem::BuildValue> *)&gtest_ar_,&system,
               (BuildKey *)local_490);
    std::__cxx11::string::_M_dispose();
    gtest_ar__2.success_ = local_5a8;
    gtest_ar__2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (local_5a8 == false) {
      testing::Message::Message((Message *)&local_710);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__1,(internal *)&gtest_ar__2,
                 (AssertionResult *)"result.hasValue()","false","true",in_R9);
      line = 0x545;
LAB_00123bf0:
      testing::internal::AssertHelper::AssertHelper
                (&local_6e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,line,(char *)gtest_ar__1._0_8_);
      testing::internal::AssertHelper::operator=(&local_6e8,(Message *)&local_710);
      testing::internal::AssertHelper::~AssertHelper(&local_6e8);
      std::__cxx11::string::_M_dispose();
      if (local_710.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_710.data_ + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__2.message_);
      llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&gtest_ar__2,&delegate);
      uVar3 = gtest_ar__2.message_;
      _Var9._M_head_impl._1_7_ = gtest_ar__2._1_7_;
      _Var9._M_head_impl._0_1_ = gtest_ar__2.success_;
      do {
        if ((__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )_Var9._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )uVar3._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl) {
          bVar4 = false;
          goto LAB_00123b84;
        }
        std::__cxx11::string::string((string *)&gtest_ar__1,(string *)_Var9._M_head_impl);
        lVar7 = std::__cxx11::string::find(&gtest_ar__1.success_,0x1c9a6d);
        std::__cxx11::string::_M_dispose();
        _Var9._M_head_impl = _Var9._M_head_impl + 1;
      } while (lVar7 == -1);
      bVar4 = true;
LAB_00123b84:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar__2);
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__2.success_ = bVar4;
      if (bVar4 == false) {
        testing::Message::Message((Message *)&local_710);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__1,(internal *)&gtest_ar__2,(AssertionResult *)0x1e3397,
                   "false","true",in_R9);
        line = 0x54f;
        goto LAB_00123bf0;
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__2.message_);
    llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::reset
              ((OptionalStorage<llbuild::buildsystem::BuildValue,_false> *)&gtest_ar_);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)"loadingResult",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_710,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
               ,0x541,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
    testing::internal::AssertHelper::operator=(&local_710,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_710);
    std::__cxx11::string::_M_dispose();
    if ((long *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
  }
  llbuild::buildsystem::BuildSystem::~BuildSystem(&system);
  llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate(&delegate);
  std::__cxx11::string::_M_dispose();
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&manifest);
LAB_00123c5f:
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&fakeDir);
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&outputDir);
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&builddb);
  if (local_708 != (long *)0x0) {
    (**(code **)(*local_708 + 8))();
  }
  llbuild::TmpDir::~TmpDir(&tempDir);
  return;
}

Assistant:

TEST(BuildSystemTaskTests, dirContentsHandleUpstreamFailure) {
  TmpDir tempDir(__func__);
  auto localFS = createLocalFileSystem();

  SmallString<256> builddb{ tempDir.str() };
  sys::path::append(builddb, "build.db");
  for (auto& c : builddb) {
    if (c == '\\')
      c = '/';
  }

  SmallString<256> outputDir{ tempDir.str() };
  sys::path::append(outputDir, "output");
  for (auto& c : outputDir) {
    if (c == '\\')
      c = '/';
  }
  SmallString<256> fakeDir{ tempDir.str() };
  sys::path::append(fakeDir, "fake");
  for (auto& c : fakeDir) {
    if (c == '\\')
      c = '/';
  }

  // Write `output` as a symlink to something that doesn't exist
  ASSERT_TRUE(localFS->createSymlink(fakeDir.str(), outputDir.str()));

  // Build with a mkdir rule
  {
    SmallString<256> manifest{ tempDir.str() };
    sys::path::append(manifest, "manifest.llbuild");
    {
      std::error_code ec;
      llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
      assert(!ec);

      os <<
      "client:\n"
      "  name: mock\n"
      "\n"
      "targets:\n"
      "  \"\": [\"<all>\"]\n"
      "\n"
      "nodes:\n"
      "  \"" << outputDir << "\": {}\n"
      "\n"
      "commands:\n"
      "  \"mkdir-output\":\n"
      "    tool: mkdir\n"
      "    outputs: [\"" << outputDir << "\"]\n"
      "    description: \"mkdir-output\"\n"
      "  \"<all>\":\n"
      "    tool: phony\n"
      "    inputs: [\"" << outputDir << "/\"]\n"
      "    outputs: [\"<all>\"]\n";
    }

    // Create the build system.
    auto keyToBuild = BuildKey::makeTarget("");
    MockBuildSystemDelegate delegate;
    BuildSystem system(delegate, createLocalFileSystem());
    system.attachDB(builddb.c_str(), nullptr);
    bool loadingResult = system.loadDescription(manifest);
    ASSERT_TRUE(loadingResult);

    // Build a specific key.
    auto result = system.build(keyToBuild);
    ASSERT_TRUE(result.hasValue());

    // Ensure that we have not had any missing inputs
    bool found = false;
    for (auto message : delegate.getMessages()) {
      if (message.find("unable to create directory") != std::string::npos) {
        found = true;
        break;
      }
    }
    ASSERT_TRUE(found);
  }
}